

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtoa.h
# Opt level: O0

char * rapidjson::internal::dtoa(double value,char *buffer,int maxDecimalPlaces)

{
  bool bVar1;
  char *buffer_00;
  int in_ESI;
  char *in_RDI;
  double in_XMM0_Qa;
  int K;
  int length;
  Double d;
  int *in_stack_000000b8;
  int *in_stack_000000c0;
  char *in_stack_000000c8;
  double in_stack_000000d0;
  undefined4 in_stack_ffffffffffffffdc;
  int in_stack_ffffffffffffffe0;
  char *local_8;
  
  Double::Double((Double *)&stack0xffffffffffffffd8,in_XMM0_Qa);
  bVar1 = Double::IsZero((Double *)&stack0xffffffffffffffd8);
  if (bVar1) {
    bVar1 = Double::Sign((Double *)&stack0xffffffffffffffd8);
    if (bVar1) {
      *in_RDI = '-';
      in_RDI = in_RDI + 1;
    }
    *in_RDI = '0';
    in_RDI[1] = '.';
    in_RDI[2] = '0';
    local_8 = in_RDI + 3;
  }
  else {
    buffer_00 = in_RDI;
    if (in_XMM0_Qa < 0.0) {
      buffer_00 = in_RDI + 1;
      *in_RDI = '-';
    }
    Grisu2(in_stack_000000d0,in_stack_000000c8,in_stack_000000c0,in_stack_000000b8);
    local_8 = Prettify(buffer_00,in_ESI,in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc);
  }
  return local_8;
}

Assistant:

inline char* dtoa(double value, char* buffer, int maxDecimalPlaces = 324) {
    RAPIDJSON_ASSERT(maxDecimalPlaces >= 1);
    Double d(value);
    if (d.IsZero()) {
        if (d.Sign())
            *buffer++ = '-';     // -0.0, Issue #289
        buffer[0] = '0';
        buffer[1] = '.';
        buffer[2] = '0';
        return &buffer[3];
    }
    else {
        if (value < 0) {
            *buffer++ = '-';
            value = -value;
        }
        int length, K;
        Grisu2(value, buffer, &length, &K);
        return Prettify(buffer, length, K, maxDecimalPlaces);
    }
}